

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanMemoryManager.cpp
# Opt level: O2

void __thiscall VulkanUtilities::VulkanMemoryManager::ShrinkMemory(VulkanMemoryManager *this)

{
  _Node_iterator_base<std::pair<const_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_VulkanUtilities::VulkanMemoryPage>,_true>
  _Var1;
  char acVar2 [8];
  long lVar3;
  ulong uVar4;
  VkDeviceSize *pVVar5;
  char *Args_2;
  const_iterator __it;
  bool bVar6;
  unsigned_long local_80;
  char local_78 [8];
  char local_70 [8];
  char local_68 [8];
  char local_60 [8];
  undefined8 local_58;
  string _msg;
  
  std::mutex::lock(&this->m_PagesMtx);
  if ((this->m_DeviceLocalReserveSize < (this->m_CurrAllocatedSize)._M_elems[0]) ||
     (this->m_HostVisibleReserveSize < (this->m_CurrAllocatedSize)._M_elems[1])) {
    _Var1._M_cur = (__node_type *)(this->m_Pages)._M_h._M_before_begin._M_nxt;
    while (__it.
           super__Node_iterator_base<std::pair<const_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_VulkanUtilities::VulkanMemoryPage>,_true>
           ._M_cur = (_Node_iterator_base<std::pair<const_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_VulkanUtilities::VulkanMemoryPage>,_true>
                      )(_Node_iterator_base<std::pair<const_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_VulkanUtilities::VulkanMemoryPage>,_true>
                        )_Var1._M_cur,
          __it.
          super__Node_iterator_base<std::pair<const_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_VulkanUtilities::VulkanMemoryPage>,_true>
          ._M_cur != (__node_type *)0x0) {
      _Var1._M_cur = *(__node_type **)
                      __it.
                      super__Node_iterator_base<std::pair<const_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_VulkanUtilities::VulkanMemoryPage>,_true>
                      ._M_cur;
      acVar2 = *(char (*) [8])
                ((long)__it.
                       super__Node_iterator_base<std::pair<const_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_VulkanUtilities::VulkanMemoryPage>,_true>
                       ._M_cur + 0xe0);
      if (acVar2 == *(char (*) [8])
                     ((long)__it.
                            super__Node_iterator_base<std::pair<const_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_VulkanUtilities::VulkanMemoryPage>,_true>
                            ._M_cur + 0xd8)) {
        lVar3 = *(long *)((long)__it.
                                super__Node_iterator_base<std::pair<const_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_VulkanUtilities::VulkanMemoryPage>,_true>
                                ._M_cur + 0x110);
        bVar6 = lVar3 != 0;
        pVVar5 = &this->m_DeviceLocalReserveSize;
        if (bVar6) {
          pVVar5 = &this->m_HostVisibleReserveSize;
        }
        uVar4 = (this->m_CurrAllocatedSize)._M_elems[bVar6];
        if (*pVVar5 < uVar4) {
          local_80 = uVar4 - (long)acVar2;
          (this->m_CurrAllocatedSize)._M_elems[bVar6] = local_80;
          Args_2 = "device-local";
          if (lVar3 != 0) {
            Args_2 = "host-visible";
          }
          local_78[0] = '\x02';
          local_78[1] = '\0';
          local_78[2] = '\0';
          local_78[3] = '\0';
          local_58 = 0;
          local_70[0] = '\0';
          local_70[1] = '\0';
          local_70[2] = '\0';
          local_70[3] = '\0';
          local_70[4] = '\0';
          local_70[5] = '\0';
          local_70[6] = '\0';
          local_70[7] = '\0';
          local_68 = acVar2;
          local_60._0_4_ = local_78._0_4_;
          Diligent::
          FormatString<char[22],std::__cxx11::string,char[15],char[13],char[8],Diligent::MemorySizeFormatter<unsigned_long>,char[28],Diligent::MemorySizeFormatter<unsigned_long>>
                    (&_msg,(Diligent *)"VulkanMemoryManager \'",(char (*) [22])&this->m_MgrName,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     "\': destroying ",(char (*) [15])Args_2,(char (*) [13])" page (",&local_68,
                     (MemorySizeFormatter<unsigned_long> *)"). Current allocated size: ",
                     (char (*) [28])&local_80,(MemorySizeFormatter<unsigned_long> *)0x2);
          if (Diligent::DebugMessageCallback != (undefined *)0x0) {
            (*(code *)Diligent::DebugMessageCallback)(0,_msg._M_dataplus._M_p,0,0,0);
          }
          std::__cxx11::string::~string((string *)&_msg);
          (*this->_vptr_VulkanMemoryManager[1])
                    (this,(long)__it.
                                super__Node_iterator_base<std::pair<const_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_VulkanUtilities::VulkanMemoryPage>,_true>
                                ._M_cur + 0x18);
          std::
          _Hashtable<VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_std::pair<const_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_VulkanUtilities::VulkanMemoryPage>,_std::allocator<std::pair<const_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_VulkanUtilities::VulkanMemoryPage>_>,_std::__detail::_Select1st,_std::equal_to<VulkanUtilities::VulkanMemoryManager::MemoryPageIndex>,_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex::Hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
          ::erase(&(this->m_Pages)._M_h,__it);
        }
      }
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_PagesMtx);
  return;
}

Assistant:

void VulkanMemoryManager::ShrinkMemory()
{
    std::lock_guard<std::mutex> Lock{m_PagesMtx};
    if (m_CurrAllocatedSize[0] <= m_DeviceLocalReserveSize && m_CurrAllocatedSize[1] <= m_HostVisibleReserveSize)
        return;

    auto it = m_Pages.begin();
    while (it != m_Pages.end())
    {
        auto curr_it = it;
        ++it;
        auto& Page          = curr_it->second;
        bool  IsHostVisible = Page.GetCPUMemory() != nullptr;
        auto  ReserveSize   = IsHostVisible ? m_HostVisibleReserveSize : m_DeviceLocalReserveSize;
        if (Page.IsEmpty() && m_CurrAllocatedSize[IsHostVisible ? 1 : 0] > ReserveSize)
        {
            auto PageSize = Page.GetPageSize();
            m_CurrAllocatedSize[IsHostVisible ? 1 : 0] -= PageSize;
            LOG_INFO_MESSAGE("VulkanMemoryManager '", m_MgrName, "': destroying ", (IsHostVisible ? "host-visible" : "device-local"),
                             " page (", Diligent::FormatMemorySize(PageSize, 2),
                             "). Current allocated size: ",
                             Diligent::FormatMemorySize(m_CurrAllocatedSize[IsHostVisible ? 1 : 0], 2));
            OnPageDestroy(Page);
            m_Pages.erase(curr_it);
        }
    }
}